

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

CNode * __thiscall
ConnmanTestMsg::ConnectNodePublic
          (ConnmanTestMsg *this,PeerManager *peerman,char *pszDest,ConnectionType conn_type)

{
  long lVar1;
  CAddress addrConnect;
  CNode *node;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac [20];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::CService((CService *)&stack0xffffffffffffff98);
  addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ = in_stack_ffffffffffffffa0;
  addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_ffffffffffffff98;
  addrConnect.super_CService.super_CNetAddr.m_addr._size = in_stack_ffffffffffffffa8;
  addrConnect.super_CService._20_20_ = in_stack_ffffffffffffffac;
  addrConnect.nTime.__d.__r = (duration)100000000;
  addrConnect.nServices = NODE_NONE;
  node = CConnman::ConnectNode
                   (&this->super_CConnman,addrConnect,&stack0xffffffffffffff98,SUB81(pszDest,0),
                    INBOUND,SUB41(conn_type,0));
  if (0x10 < in_stack_ffffffffffffffa8) {
    free((void *)in_stack_ffffffffffffff98);
  }
  if (node != (CNode *)0x0) {
    LOCK();
    (node->m_greatest_common_version).super___atomic_base<int>._M_i = 0x11180;
    UNLOCK();
    (**(peerman->super_NetEventsInterface)._vptr_NetEventsInterface)
              (&peerman->super_NetEventsInterface,node,9);
    LOCK();
    (node->fSuccessfullyConnected)._M_base._M_i = true;
    UNLOCK();
    AddTestNode(this,node);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return node;
  }
  __stack_chk_fail();
}

Assistant:

CNode* ConnmanTestMsg::ConnectNodePublic(PeerManager& peerman, const char* pszDest, ConnectionType conn_type)
{
    CNode* node = ConnectNode(CAddress{}, pszDest, /*fCountFailure=*/false, conn_type, /*use_v2transport=*/true);
    if (!node) return nullptr;
    node->SetCommonVersion(PROTOCOL_VERSION);
    peerman.InitializeNode(*node, ServiceFlags(NODE_NETWORK | NODE_WITNESS));
    node->fSuccessfullyConnected = true;
    AddTestNode(*node);
    return node;
}